

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

ostream * ClipperLib::operator<<(ostream *s,Polygon *p)

{
  pointer pIVar1;
  ulong uVar2;
  long lVar3;
  
  pIVar1 = (p->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((p->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)._M_impl.
      super__Vector_impl_data._M_finish != pIVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      operator<<(s,(IntPoint *)((long)&pIVar1->X + lVar3));
      uVar2 = uVar2 + 1;
      pIVar1 = (p->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < (ulong)((long)(p->
                                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 4))
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"\n",1);
  return s;
}

Assistant:

std::ostream& operator <<(std::ostream &s, Polygon &p)
{
  for (Polygon::size_type i = 0; i < p.size(); i++)
    s << p[i];
  s << "\n";
  return s;
}